

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

size_t Catch::anon_unknown_1::trailingBytes(uchar c)

{
  string *msg;
  byte in_DIL;
  ReusableStringStream *in_stack_ffffffffffffff68;
  ReusableStringStream *in_stack_ffffffffffffff70;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  SourceLineInfo local_58 [5];
  size_t local_8;
  
  if ((in_DIL & 0xe0) == 0xc0) {
    local_8 = 2;
  }
  else if ((in_DIL & 0xf0) == 0xe0) {
    local_8 = 3;
  }
  else {
    if ((in_DIL & 0xf8) != 0xf0) {
      ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffa0);
      SourceLineInfo::SourceLineInfo
                (local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2/include/catch2/catch.2.13.10.hpp"
                 ,0x3c60);
      msg = (string *)
            ReusableStringStream::operator<<
                      (in_stack_ffffffffffffff70,(SourceLineInfo *)in_stack_ffffffffffffff68);
      ReusableStringStream::operator<<
                (in_stack_ffffffffffffff70,(char (*) [26])in_stack_ffffffffffffff68);
      ReusableStringStream::operator<<
                (in_stack_ffffffffffffff70,(char (*) [47])in_stack_ffffffffffffff68);
      ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff68);
      throw_logic_error(msg);
    }
    local_8 = 4;
  }
  return local_8;
}

Assistant:

size_t trailingBytes(unsigned char c) {
        if ((c & 0xE0) == 0xC0) {
            return 2;
        }
        if ((c & 0xF0) == 0xE0) {
            return 3;
        }
        if ((c & 0xF8) == 0xF0) {
            return 4;
        }
        CATCH_INTERNAL_ERROR("Invalid multibyte utf-8 start byte encountered");
    }